

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_memory_object.h
# Opt level: O0

void __thiscall
SharedMemoryObject<pthread_barrier_t>::~SharedMemoryObject
          (SharedMemoryObject<pthread_barrier_t> *this)

{
  int iVar1;
  ContextManager *pCVar2;
  string local_30;
  SharedMemoryObject<pthread_barrier_t> *local_10;
  SharedMemoryObject<pthread_barrier_t> *this_local;
  
  local_10 = this;
  iVar1 = free_shared_memory(this->ptr_,0x20);
  if (iVar1 != 0) {
    pCVar2 = ContextManager::get();
    format_abi_cxx11_(&local_30,"Cannot free shared memory at %p: %m",this->ptr_);
    (**pCVar2->_vptr_ContextManager)(pCVar2,&local_30);
    std::__cxx11::string::~string((string *)&local_30);
  }
  return;
}

Assistant:

~SharedMemoryObject() {
        if (free_shared_memory(ptr_, sizeof(T)) != 0) {
            die(format("Cannot free shared memory at %p: %m", ptr_));
        }
    }